

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Validator::operator()(string *__return_storage_ptr__,Validator *this,string *str)

{
  pointer pcVar1;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + str->_M_string_length);
  if (this->active_ == true) {
    if ((this->func_).super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->func_)._M_invoker)(__return_storage_ptr__,(_Any_data *)&this->func_,&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const std::string &str) const {
        std::string value = str;
        return (active_) ? func_(value) : std::string{};
    }